

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O3

void __thiscall
Minisat::OnlineProofChecker::addParsedclause(OnlineProofChecker *this,vec<Minisat::Lit> *cls)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint uVar1;
  iterator __position;
  uint uVar2;
  int iVar3;
  int iVar4;
  Lit *pLVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  CRef ref;
  uint local_3c;
  Watcher local_38;
  
  iVar3 = cls->sz;
  if (iVar3 == 0) {
    *this = (OnlineProofChecker)0x0;
    return;
  }
  if (0 < iVar3) {
    iVar4 = *(int *)(this + 0xe0);
    pLVar5 = cls->data;
    lVar8 = 0;
    do {
      if (iVar4 <= pLVar5[lVar8].x >> 1) {
        do {
          newVar(this);
          iVar4 = *(int *)(this + 0xe0);
          pLVar5 = cls->data;
        } while (iVar4 <= pLVar5[lVar8].x >> 1);
        iVar3 = cls->sz;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar3);
    if (1 < iVar3) {
      local_3c = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                           ((ClauseAllocator *)(this + 8),cls,false);
      if (0 < cls->sz) {
        lVar8 = 0;
        do {
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    (*(long *)(this + 0x40) + (long)cls->data[lVar8].x * 0x18);
          __position._M_current = *(uint **)(this_00 + 8);
          if (__position._M_current == *(uint **)(this_00 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_3c);
          }
          else {
            *__position._M_current = local_3c;
            *(uint **)(this_00 + 8) = __position._M_current + 1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < cls->sz);
      }
      uVar1 = local_3c;
      lVar8 = *(long *)(this + 8);
      uVar7 = (ulong)local_3c;
      local_38.blocker.x = *(int *)(lVar8 + 0xc + uVar7 * 4);
      local_38.cref = local_3c;
      vec<Minisat::Watcher>::push
                ((vec<Minisat::Watcher> *)
                 (((long)*(int *)(lVar8 + 8 + uVar7 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
                 &local_38);
      local_38.blocker.x = *(int *)(lVar8 + 8 + uVar7 * 4);
      local_38.cref = uVar1;
      vec<Minisat::Watcher>::push
                ((vec<Minisat::Watcher> *)
                 (((long)*(int *)(lVar8 + 0xc + uVar7 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
                 &local_38);
      vec<unsigned_int>::push((vec<unsigned_int> *)(this + 0x20),&local_3c);
      goto LAB_00108f2f;
    }
  }
  vec<Minisat::Lit>::push((vec<Minisat::Lit> *)(this + 0x30),cls->data);
LAB_00108f2f:
  if (1 < *(int *)(this + 0xf8)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"c added clause ",0xf);
    if (0 < cls->sz) {
      lVar8 = 0;
      do {
        uVar1 = cls->data[lVar8].x;
        uVar6 = (int)uVar1 >> 1;
        uVar2 = ~uVar6;
        if ((uVar1 & 1) == 0) {
          uVar2 = uVar6 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar2);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        lVar8 = lVar8 + 1;
      } while (lVar8 < cls->sz);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  return;
}

Assistant:

inline void OnlineProofChecker::addParsedclause(const vec<Lit> &cls)
{
    if (cls.size() == 0) {
        ok = false;
        return;
    }

    // have enough variables present
    for (int i = 0; i < cls.size(); ++i) {
        while (nVars() <= var(cls[i])) {
            newVar();
        }
    }

    if (cls.size() > 1) {
        CRef ref = ca.alloc(cls, false);
        for (int i = 0; i < cls.size(); ++i) {
            occ[toInt(cls[i])].push_back(ref);
        }
        attachClause(ref);
        clauses.push(ref);
    } else {
        unitClauses.push(cls[0]);
    }

    if (verbose > 1) {
        std::cerr << "c added clause " << cls << std::endl;
    }
    // here, do not check whether the clause is entailed, because its still input!
}